

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O0

int add_f3_gquad(vrna_fold_compound_t *fc,int i,vrna_callback_hc_evaluate *evaluate,
                default_data *hc_dat_local,sc_wrapper_f3 *sc_wrapper)

{
  uint uVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  int local_60;
  int local_5c;
  int maxdist;
  int *ggg;
  int *f3;
  int turn;
  int length;
  int j;
  int e;
  sc_wrapper_f3 *sc_wrapper_local;
  default_data *hc_dat_local_local;
  vrna_callback_hc_evaluate *evaluate_local;
  int i_local;
  vrna_fold_compound_t *fc_local;
  
  uVar1 = fc->length;
  piVar2 = (fc->matrices->field_2).field_0.f5;
  lVar3 = *(long *)((fc->matrices->field_2).field_0.fc + (long)i * 2);
  length = 10000000;
  turn = i + (fc->params->model_details).min_loop_size;
  while (iVar4 = turn, turn = iVar4 + 1, turn < (int)uVar1 && turn <= i + fc->window_size) {
    if ((piVar2[iVar4 + 2] != 10000000) && (*(int *)(lVar3 + (long)(turn - i) * 4) != 10000000)) {
      if (length < piVar2[iVar4 + 2] + *(int *)(lVar3 + (long)(turn - i) * 4)) {
        local_5c = length;
      }
      else {
        local_5c = piVar2[iVar4 + 2] + *(int *)(lVar3 + (long)(turn - i) * 4);
      }
      length = local_5c;
    }
  }
  if ((int)uVar1 <= i + fc->window_size) {
    if (length < *(int *)(lVar3 + (long)(int)(uVar1 - i) * 4)) {
      local_60 = length;
    }
    else {
      local_60 = *(int *)(lVar3 + (long)(int)(uVar1 - i) * 4);
    }
    length = local_60;
  }
  return length;
}

Assistant:

int
add_f3_gquad(vrna_fold_compound_t       *fc,
             int                        i,
             vrna_callback_hc_evaluate  *evaluate,
             struct default_data        *hc_dat_local,
             struct sc_wrapper_f3       *sc_wrapper)
{
  int e, j, length, turn, *f3, *ggg, maxdist;

  length  = (int)fc->length;
  maxdist = fc->window_size;
  f3      = fc->matrices->f3_local;
  ggg     = fc->matrices->ggg_local[i];
  turn    = fc->params->model_details.min_loop_size;
  e       = INF;

  for (j = i + turn + 1; (j < length) && (j <= i + maxdist); j++)
    if ((f3[j + 1] != INF) && (ggg[j - i] != INF))
      e = MIN2(e, f3[j + 1] + ggg[j - i]);

  if (length <= i + maxdist)
    e = MIN2(e, ggg[length - i]);

  return e;
}